

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::DecomposeSymmetric(ON_Xform *this,ON_Xform *Q,ON_3dVector *diagonal)

{
  double *pdVar1;
  double D;
  double F;
  double E;
  bool bVar2;
  long lVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  ON_3dVector evec [3];
  ON_Xform local_a8;
  
  bVar5 = 0;
  bVar2 = IsLinear(this);
  if (bVar2) {
    D = this->m_xform[0][1];
    if ((D == this->m_xform[1][0]) && (!NAN(D) && !NAN(this->m_xform[1][0]))) {
      F = this->m_xform[0][2];
      if ((F == this->m_xform[2][0]) && (!NAN(F) && !NAN(this->m_xform[2][0]))) {
        E = this->m_xform[1][2];
        pdVar1 = this->m_xform[2] + 1;
        if ((E == *pdVar1) && (!NAN(E) && !NAN(*pdVar1))) {
          bVar2 = ON_Sym3x3EigenSolver
                            (this->m_xform[0][0],this->m_xform[1][1],this->m_xform[2][2],D,E,F,
                             &diagonal->x,evec,&diagonal->y,evec + 1,&diagonal->z,evec + 2);
          if (!bVar2) {
            return bVar2;
          }
          ON_Xform(&local_a8,&ON_3dPoint::Origin,evec,evec + 1,evec + 2);
          pOVar4 = &local_a8;
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            Q->m_xform[0][0] = pOVar4->m_xform[0][0];
            pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
            Q = (ON_Xform *)((long)Q + ((ulong)bVar5 * -2 + 1) * 8);
          }
          return bVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Xform::DecomposeSymmetric(ON_Xform& Q, ON_3dVector& diagonal) const
{
	bool rc = false;
	if (IsLinear())
	{
		bool symmetric  = ( m_xform[0][1] == m_xform[1][0] && 
			m_xform[0][2] == m_xform[2][0] && 
			m_xform[1][2] == m_xform[2][1]  );
		if (symmetric)
		{
			ON_3dVector evec[3];
			rc = ON_Sym3x3EigenSolver(m_xform[0][0], m_xform[1][1], m_xform[2][2],
				m_xform[0][1], m_xform[1][2], m_xform[0][2],
				&diagonal.x, evec[0],
				&diagonal.y, evec[1],
				&diagonal.z, evec[2]);
			if (rc)
			{
				Q = ON_Xform(ON_3dPoint::Origin, evec[0], evec[1], evec[2]);
			}
		}
	}
	return rc;
}